

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

uint8_t __thiscall wabt::ElemSegment::GetFlags(ElemSegment *this,Module *module)

{
  SegmentKind SVar1;
  bool bVar2;
  Index IVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  bool local_59;
  bool all_ref_func;
  byte local_19;
  Index table_index;
  uint8_t flags;
  Module *module_local;
  ElemSegment *this_local;
  
  local_19 = 0;
  SVar1 = this->kind;
  if (SVar1 == Active) {
    IVar3 = Module::GetTableIndex(module,&this->table_var);
    bVar2 = wabt::operator!=(this->elem_type,FuncRef);
    if ((bVar2) || (IVar3 != 0)) {
      local_19 = 2;
    }
  }
  else if (SVar1 == Passive) {
    local_19 = 1;
  }
  else if (SVar1 == Declared) {
    local_19 = 3;
  }
  bVar2 = wabt::operator==(this->elem_type,FuncRef);
  local_59 = false;
  if (bVar2) {
    cVar4 = std::
            vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
            ::begin(&this->elem_exprs);
    cVar5 = std::
            vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
            ::end(&this->elem_exprs);
    local_59 = std::
               all_of<__gnu_cxx::__normal_iterator<wabt::intrusive_list<wabt::Expr>const*,std::vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>>,wabt::ElemSegment::GetFlags(wabt::Module_const*)const::__0>
                         (cVar4._M_current,cVar5._M_current);
  }
  if (local_59 == false) {
    local_19 = local_19 | 4;
  }
  return local_19;
}

Assistant:

uint8_t ElemSegment::GetFlags(const Module* module) const {
  uint8_t flags = 0;

  switch (kind) {
    case SegmentKind::Active: {
      Index table_index = module->GetTableIndex(table_var);
      if (elem_type != Type::FuncRef || table_index != 0) {
        flags |= SegExplicitIndex;
      }
      break;
    }

    case SegmentKind::Passive:
      flags |= SegPassive;
      break;

    case SegmentKind::Declared:
      flags |= SegDeclared;
      break;
  }

  bool all_ref_func =
      elem_type == Type::FuncRef &&
      std::all_of(elem_exprs.begin(), elem_exprs.end(),
                  [](const ExprList& elem_expr) {
                    return elem_expr.front().type() == ExprType::RefFunc;
                  });

  if (!all_ref_func) {
    flags |= SegUseElemExprs;
  }

  return flags;
}